

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O2

uint32_t __thiscall cppnet::BufferQueue::Write(BufferQueue *this,char *str,uint32_t len)

{
  shared_ptr<cppnet::BufferBlock> *this_00;
  int iVar1;
  uint32_t uVar2;
  element_type *peVar3;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  uVar2 = 0;
  if (len != 0 && str != (char *)0x0) {
    this_00 = &this->_buffer_write;
    uVar2 = 0;
    while( true ) {
      peVar3 = (this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      if (peVar3 == (element_type *)0x0) {
        (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])(this);
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,
                   &(this->_buffer_list)._tail.
                    super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>,
                   &local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        peVar3 = (this->_buffer_write).
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      iVar1 = (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[10])
                        (peVar3,str + uVar2,(ulong)(len - uVar2));
      uVar2 = uVar2 + iVar1;
      if (len <= uVar2) break;
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 &(((this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ListSlot<cppnet::BufferBlock>)._next.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>,
                 &local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    this->_can_read_length = this->_can_read_length + uVar2;
  }
  return uVar2;
}

Assistant:

uint32_t BufferQueue::Write(const char* str, uint32_t len) {
    if (!str || len == 0) {
        return 0;
    }
    
    uint32_t write_len = 0;

    while (1) {
        if (!_buffer_write) {
            Append();
            _buffer_write = _buffer_list.GetTail();
        }

        write_len += _buffer_write->Write(str + write_len, len - write_len);

        if (write_len >= len) {
            break;
        }
        _buffer_write = _buffer_write->GetNext();
    }
    _can_read_length += write_len;
    return write_len;
}